

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::(anonymous_namespace)::AdvancedPipelinePostFS::Method_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "\n1. Render image to Texture0 using VS and FS.\n2. Use Texture0 as an input to Kernel0 which performs post-processing and writes result to Texture1.\n3. Issue MemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT) command.\n4. Use Texture1 as an input to Kernel1 which performs post-processing and writes result to Texture0.\n5. Issue MemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT) command.\n6. Verify content of the final post-processed image (Texture0)."
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Method()
	{
		return NL
			"1. Render image to Texture0 using VS and FS." NL
			"2. Use Texture0 as an input to Kernel0 which performs post-processing and writes result to Texture1." NL
			"3. Issue MemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT) command." NL
			"4. Use Texture1 as an input to Kernel1 which performs post-processing and writes result to Texture0." NL
			"5. Issue MemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT) command." NL
			"6. Verify content of the final post-processed image (Texture0).";
	}